

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void MergeUVRow_AVX2(uint8_t *src_u,uint8_t *src_v,uint8_t *dst_uv,int width)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [32];
  int iVar5;
  long lVar6;
  int width_local;
  uint8_t *dst_uv_local;
  uint8_t *src_v_local;
  uint8_t *src_u_local;
  
  lVar6 = (long)src_v - (long)src_u;
  do {
    auVar1 = *(undefined1 (*) [32])src_u;
    auVar2 = *(undefined1 (*) [32])((long)src_u + lVar6);
    src_u = (uint8_t *)((long)src_u + 0x20);
    auVar4 = vpunpcklbw_avx2(auVar1,auVar2);
    auVar1 = vpunpckhbw_avx2(auVar1,auVar2);
    *(undefined1 (*) [16])dst_uv = auVar4._0_16_;
    *(undefined1 (*) [16])((long)dst_uv + 0x10) = auVar1._0_16_;
    *(undefined1 (*) [16])((long)dst_uv + 0x20) = auVar4._16_16_;
    *(undefined1 (*) [16])((long)dst_uv + 0x30) = auVar1._16_16_;
    dst_uv = (uint8_t *)((long)dst_uv + 0x40);
    iVar5 = width + -0x20;
    bVar3 = 0x1f < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar3);
  return;
}

Assistant:

void MergeUVRow_AVX2(const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* dst_uv,
                     int width) {
  asm volatile(

      "sub         %0,%1                         \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x00(%0,%1,1),%%ymm1          \n"
      "lea         0x20(%0),%0                   \n"
      "vpunpcklbw  %%ymm1,%%ymm0,%%ymm2          \n"
      "vpunpckhbw  %%ymm1,%%ymm0,%%ymm0          \n"
      "vextractf128 $0x0,%%ymm2,(%2)             \n"
      "vextractf128 $0x0,%%ymm0,0x10(%2)         \n"
      "vextractf128 $0x1,%%ymm2,0x20(%2)         \n"
      "vextractf128 $0x1,%%ymm0,0x30(%2)         \n"
      "lea         0x40(%2),%2                   \n"
      "sub         $0x20,%3                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_u),   // %0
        "+r"(src_v),   // %1
        "+r"(dst_uv),  // %2
        "+r"(width)    // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}